

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O3

Result * CoreML::Model::enforceTypeInvariant
                   (Result *__return_storage_ptr__,
                   vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_>
                   *allowedFeatureTypes,FeatureType *featureType)

{
  pointer pFVar1;
  bool bVar2;
  pointer other;
  
  other = (allowedFeatureTypes->
          super__Vector_base<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_>)._M_impl.
          super__Vector_impl_data._M_start;
  pFVar1 = (allowedFeatureTypes->
           super__Vector_base<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    if (other == pFVar1) {
      Result::featureTypeInvariantError(__return_storage_ptr__,allowedFeatureTypes,featureType);
      return __return_storage_ptr__;
    }
    bVar2 = FeatureType::operator==(featureType,other);
    if (bVar2) break;
    other = other + 1;
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result Model::enforceTypeInvariant(const std::vector<FeatureType>& allowedFeatureTypes,
                                       FeatureType featureType) {
        
        for (const FeatureType& t : allowedFeatureTypes) {
            if (featureType == t) {
                // no invariant broken -- type matches one of the allowed types
                return Result();
            }
        }
        
        return Result::featureTypeInvariantError(allowedFeatureTypes, featureType);
    }